

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::CallContextHooks(ImGuiContext *ctx,ImGuiContextHookType hook_type)

{
  code *pcVar1;
  ImGuiContextHook *pIVar2;
  int in_ESI;
  ImVector<ImGuiContextHook> *in_RDI;
  int n;
  ImGuiContext *g;
  int in_stack_ffffffffffffffcc;
  ImVector<ImGuiContextHook> *in_stack_ffffffffffffffd0;
  int local_1c;
  
  for (local_1c = 0; local_1c < *(int *)&in_RDI[0x2f4].Data; local_1c = local_1c + 1) {
    pIVar2 = ImVector<ImGuiContextHook>::operator[]
                       (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    if (*(int *)(pIVar2 + 4) == in_ESI) {
      pIVar2 = ImVector<ImGuiContextHook>::operator[]
                         (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
      pcVar1 = *(code **)(pIVar2 + 0x10);
      in_stack_ffffffffffffffd0 = in_RDI;
      pIVar2 = ImVector<ImGuiContextHook>::operator[](in_RDI,in_stack_ffffffffffffffcc);
      (*pcVar1)(in_stack_ffffffffffffffd0,pIVar2);
    }
  }
  return;
}

Assistant:

void ImGui::CallContextHooks(ImGuiContext* ctx, ImGuiContextHookType hook_type)
{
    ImGuiContext& g = *ctx;
    for (int n = 0; n < g.Hooks.Size; n++)
        if (g.Hooks[n].Type == hook_type)
            g.Hooks[n].Callback(&g, &g.Hooks[n]);
}